

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O3

void __thiscall duckdb::Binder::BindCreateViewInfo(Binder *this,CreateViewInfo *base)

{
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> *this_00;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  RETURN_TYPE RVar3;
  Catalog *catalog;
  DBConfig *this_01;
  Binder *pBVar4;
  pointer pSVar5;
  type stmt;
  BinderException *this_02;
  shared_ptr<duckdb::Binder,_true> view_binder;
  vector<duckdb::CatalogSearchEntry,_true> view_search_path;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_f0;
  undefined1 local_e8 [24];
  pointer pCStack_d0;
  _Hash_node_base *local_c8;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_98;
  string local_78;
  undefined1 local_58 [32];
  pointer local_38;
  pointer local_30;
  
  CreateBinder((Binder *)local_e8,this->context,(optional_ptr<duckdb::Binder,_true>)0x0,
               REGULAR_BINDER);
  catalog = Catalog::GetCatalog(this->context,&(base->super_CreateInfo).catalog);
  this_01 = DBConfig::GetConfig(this->context);
  RVar3 = DBConfig::GetSetting<duckdb::EnableViewDependenciesSetting>(this_01,this->context);
  if (RVar3) {
    pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_e8);
    local_b8._M_unused._M_object = &(base->super_CreateInfo).dependencies;
    local_a0 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_create.cpp:161:41)>
               ::_M_invoke;
    local_a8 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/binder/statement/bind_create.cpp:161:41)>
               ::_M_manager;
    local_b8._8_8_ = catalog;
    SetCatalogLookupCallback(pBVar4,(catalog_entry_callback_t *)&local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
  }
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_e8);
  pBVar4->can_contain_nulls = true;
  GetSearchPath((vector<duckdb::CatalogSearchEntry,_true> *)(local_e8 + 0x10),this,catalog,
                &(base->super_CreateInfo).schema);
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_e8);
  local_98.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._16_8_;
  local_98.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = pCStack_d0;
  local_98.
  super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
  local_e8._16_8_ = (ClientContext *)0x0;
  pCStack_d0 = (pointer)0x0;
  local_c8 = (_Hash_node_base *)0x0;
  CatalogEntryRetriever::SetSearchPath
            (&pBVar4->entry_retriever,(vector<duckdb::CatalogSearchEntry,_true> *)&local_98);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_98);
  this_00 = &base->query;
  pSVar5 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator->(this_00);
  (*(pSVar5->super_SQLStatement)._vptr_SQLStatement[3])(&local_f0,pSVar5);
  pBVar4 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)local_e8);
  stmt = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
         operator*(this_00);
  Bind((BoundStatement *)local_58,pBVar4,stmt);
  _Var2._M_head_impl = local_f0._M_head_impl;
  local_f0._M_head_impl = (SelectStatement *)0x0;
  _Var1._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_SQLStatement + 8))();
  }
  if ((ulong)((long)(base->aliases).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(base->aliases).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) <=
      (ulong)((long)local_30 - (long)local_38)) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&base->types,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_58 + 8));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&base->names,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_38);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_38);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_58 + 8));
    if ((LogicalOperator *)local_58._0_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_58._0_8_)[1])();
    }
    if (local_f0._M_head_impl != (SelectStatement *)0x0) {
      (*((local_f0._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
              ((vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> *)
               (local_e8 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    return;
  }
  this_02 = (BinderException *)__cxa_allocate_exception(0x10);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"More VIEW aliases than columns in query result","");
  BinderException::BinderException(this_02,&local_78);
  __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::BindCreateViewInfo(CreateViewInfo &base) {
	// bind the view as if it were a query so we can catch errors
	// note that we bind the original, and replace the original with a copy
	auto view_binder = Binder::CreateBinder(context);
	auto &dependencies = base.dependencies;
	auto &catalog = Catalog::GetCatalog(context, base.catalog);

	auto &db_config = DBConfig::GetConfig(context);
	bool should_create_dependencies = db_config.GetSetting<EnableViewDependenciesSetting>(context);
	if (should_create_dependencies) {
		view_binder->SetCatalogLookupCallback([&dependencies, &catalog](CatalogEntry &entry) {
			if (&catalog != &entry.ParentCatalog()) {
				// Don't register dependencies between catalogs
				return;
			}
			dependencies.AddDependency(entry);
		});
	}
	view_binder->can_contain_nulls = true;

	auto view_search_path = GetSearchPath(catalog, base.schema);
	view_binder->entry_retriever.SetSearchPath(std::move(view_search_path));

	auto copy = base.query->Copy();
	auto query_node = view_binder->Bind(*base.query);
	base.query = unique_ptr_cast<SQLStatement, SelectStatement>(std::move(copy));
	if (base.aliases.size() > query_node.names.size()) {
		throw BinderException("More VIEW aliases than columns in query result");
	}
	base.types = query_node.types;
	base.names = query_node.names;
}